

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::TailoredSet::addPrefix
          (TailoredSet *this,CollationData *d,UnicodeString *pfx,UChar32 c,uint32_t ce32)

{
  char16_t *pcVar1;
  UnicodeSet *this_00;
  UBool UVar2;
  int32_t iVar3;
  UnicodeString *s;
  UnicodeString local_70;
  char16_t *local_30;
  UChar *p;
  uint32_t ce32_local;
  UChar32 c_local;
  UnicodeString *pfx_local;
  CollationData *d_local;
  TailoredSet *this_local;
  
  p._0_4_ = ce32;
  p._4_4_ = c;
  _ce32_local = pfx;
  pfx_local = (UnicodeString *)d;
  d_local = (CollationData *)this;
  setPrefix(this,pfx);
  p._0_4_ = CollationData::getFinalCE32((CollationData *)pfx_local,(uint32_t)p);
  UVar2 = Collation::isContractionCE32((uint32_t)p);
  if (UVar2 != '\0') {
    pcVar1 = (pfx_local->fUnion).fFields.fArray;
    iVar3 = Collation::indexFromCE32((uint32_t)p);
    local_30 = pcVar1 + iVar3;
    addContractions(this,p._4_4_,local_30 + 2);
  }
  this_00 = this->tailored;
  icu_63::UnicodeString::UnicodeString(&local_70,&this->unreversedPrefix);
  s = icu_63::UnicodeString::append(&local_70,p._4_4_);
  UnicodeSet::add(this_00,s);
  icu_63::UnicodeString::~UnicodeString(&local_70);
  resetPrefix(this);
  return;
}

Assistant:

void
TailoredSet::addPrefix(const CollationData *d, const UnicodeString &pfx, UChar32 c, uint32_t ce32) {
    setPrefix(pfx);
    ce32 = d->getFinalCE32(ce32);
    if(Collation::isContractionCE32(ce32)) {
        const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
        addContractions(c, p + 2);
    }
    tailored->add(UnicodeString(unreversedPrefix).append(c));
    resetPrefix();
}